

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O0

err_t cvrPrint(int argc,char **argv)

{
  int iVar1;
  cmd_sig_t *sig_00;
  long *in_RSI;
  int in_EDI;
  size_t count;
  octet *certs;
  size_t ring_len;
  cmd_sig_t *sig;
  size_t sig_len;
  void *stack;
  char *scope;
  err_t code;
  char *in_stack_ffffffffffffffa8;
  size_t size;
  octet *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  cmd_sig_t *certs_00;
  long local_20;
  err_t local_14;
  err_t local_4;
  
  if (in_EDI == 1) {
    local_20 = 0;
  }
  else {
    if ((in_EDI != 2) ||
       (iVar1 = strCmp((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), iVar1 != 0)) {
      return 0x25b;
    }
    local_20 = *in_RSI + 1;
  }
  local_4 = cmdFileValExist(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if ((local_4 == 0) &&
     (local_4 = cmdFileReadAll(in_stack_ffffffffffffffc8,
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               (char *)in_stack_ffffffffffffffb8), local_4 == 0)) {
    if (CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) < 0x630) {
      size = 0x630;
    }
    else {
      size = CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    }
    sig_00 = (cmd_sig_t *)blobCreate(size);
    local_4 = 0x6e;
    if (sig_00 != (cmd_sig_t *)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      certs_00 = sig_00;
      local_4 = cmdSigRead(sig_00,(size_t *)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (char *)sig_00);
      if (local_4 == 0) {
        local_4 = cmdFileReadAll(certs_00,(size_t *)
                                          CONCAT44(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0),(char *)sig_00);
        if (local_4 == 0) {
          local_14 = cmdCVCsCount((size_t *)sig_00,in_stack_ffffffffffffffb0,size);
          if (local_14 == 0) {
            if (local_20 == 0) {
              printf("certc: %u\n",(ulong)in_stack_ffffffffffffffb0 & 0xffffffff);
              if (in_stack_ffffffffffffffb0 != (octet *)0x0) {
                printf("certs:\n");
                local_14 = cmdCVCsPrint(certs_00->sig,
                                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ));
              }
            }
            else {
              printf("%u\n",(ulong)in_stack_ffffffffffffffb0 & 0xffffffff);
            }
            blobClose((blob_t)0x11225a);
            local_4 = local_14;
          }
          else {
            blobClose((blob_t)0x1121e4);
            local_4 = local_14;
          }
        }
        else {
          blobClose((blob_t)0x1121a9);
        }
      }
      else {
        blobClose((blob_t)0x112170);
      }
    }
  }
  return local_4;
}

Assistant:

static err_t cvrPrint(int argc, char* argv[])
{
	err_t code;
	const char* scope;
	void* stack;
	size_t sig_len;
	cmd_sig_t* sig;
	size_t ring_len;
	octet* certs;
	size_t count;
	// обработать опции
	if (argc == 1)
		scope = 0;
	else if (argc == 2 && strEq(argv[0], "-certc"))
		scope = argv[0], ++scope, ++argv, --argc;
	else
		return ERR_CMD_PARAMS;
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv);
	ERR_CALL_CHECK(code);
	// определить длину кольца
	code = cmdFileReadAll(0, &ring_len, argv[0]);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, MAX2(sizeof(cmd_sig_t), ring_len));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	certs = (octet*)stack;
	// определить длину подписи
	code = cmdSigRead(sig, &sig_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// прочитать кольцо
	code = cmdFileReadAll(certs, &ring_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить число сертификатов
	ASSERT(sig_len <= ring_len);
	code = cmdCVCsCount(&count, certs, ring_len - sig_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// печатать 
	if (!scope)
	{
		printf("certc: %u\n", (unsigned)count);
		if (count)
		{
			printf("certs:\n");
			code = cmdCVCsPrint(certs, ring_len - sig_len);
		}
	}
	else 
		printf("%u\n", (unsigned)count);
	// завершить
	cmdBlobClose(stack);
	return code;
}